

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_library_init.c
# Opt level: O0

void * ares_realloc_zero(void *ptr,size_t orig_size,size_t new_size)

{
  void *p;
  size_t new_size_local;
  size_t orig_size_local;
  void *ptr_local;
  
  ptr_local = ares_realloc(ptr,new_size);
  if (ptr_local == (void *)0x0) {
    ptr_local = (void *)0x0;
  }
  else if (orig_size < new_size) {
    memset((void *)((long)ptr_local + orig_size),0,new_size - orig_size);
  }
  return ptr_local;
}

Assistant:

void *ares_realloc_zero(void *ptr, size_t orig_size, size_t new_size)
{
  void *p = ares_realloc(ptr, new_size);
  if (p == NULL) {
    return NULL;
  }

  if (new_size > orig_size) {
    memset((unsigned char *)p + orig_size, 0, new_size - orig_size);
  }

  return p;
}